

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_log2.hpp
# Opt level: O0

int __thiscall boost::detail::integer_log2_impl<unsigned_long>(detail *this,unsigned_long x,int n)

{
  ulong uVar1;
  unsigned_long t;
  int result;
  int n_local;
  unsigned_long x_local;
  
  n_local = (int)x;
  result = 0;
  x_local = (unsigned_long)this;
  while (x_local != 1) {
    uVar1 = x_local >> ((byte)n_local & 0x3f);
    if (uVar1 != 0) {
      result = n_local + result;
      x_local = uVar1;
    }
    n_local = n_local / 2;
  }
  return result;
}

Assistant:

int integer_log2_impl(T x, int n) {

      int result = 0;

      while (x != 1) {

          const T t = static_cast<T>(x >> n);
          if (t) {
              result += n;
              x = t;
          }
          n /= 2;

      }

      return result;
  }